

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

void __thiscall chrono::ChArchiveOut::VersionWrite(ChArchiveOut *this,int iv)

{
  int local_1c;
  char *local_18;
  int *local_10;
  undefined1 local_8;
  
  if ((this->super_ChArchive).use_versions == true) {
    local_10 = &local_1c;
    local_18 = "_version";
    local_8 = 0;
    local_1c = iv;
    (*(this->super_ChArchive)._vptr_ChArchive[3])();
  }
  return;
}

Assistant:

void VersionWrite(int iv) {
          if (use_versions) {
            this->out(ChNameValue<int>("_version", iv));
          }
      }